

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtMatrix3x3.h
# Opt level: O2

void __thiscall cbtMatrix3x3::getRotation(cbtMatrix3x3 *this,cbtQuaternion *q)

{
  float fVar1;
  ulong uVar2;
  float fVar3;
  undefined1 auVar4 [16];
  int iVar5;
  long lVar6;
  ulong uVar7;
  uint uVar8;
  undefined1 auVar9 [16];
  float fVar10;
  float fVar11;
  undefined1 auVar13 [64];
  cbtScalar local_48 [3];
  float fStack_3c;
  cbtQuaternion *local_38;
  undefined1 auVar12 [16];
  undefined1 extraout_var [60];
  
  fVar10 = this->m_el[0].m_floats[0];
  fVar11 = this->m_el[1].m_floats[1];
  fVar1 = this->m_el[2].m_floats[2];
  fVar3 = fVar10 + fVar11 + fVar1;
  if (fVar3 <= 0.0) {
    uVar8 = (uint)(fVar10 < fVar1) * 2;
    if (fVar10 < fVar11) {
      uVar8 = (fVar11 < fVar1) + 1;
    }
    iVar5 = uVar8 + 1;
    if (uVar8 + 1 == 3) {
      iVar5 = 0;
    }
    uVar7 = (ulong)uVar8;
    lVar6 = (long)iVar5;
    uVar2 = (ulong)(uVar8 + 2) % 3;
    uVar8 = (int)uVar2 << 4;
    fVar10 = ((*(float *)((long)this->m_el + uVar7 * 0x14) -
              *(float *)((long)this->m_el + lVar6 * 0x14)) -
             *(float *)((long)this->m_el[0].m_floats + uVar2 * 4 + (ulong)uVar8)) + 1.0;
    if (fVar10 < 0.0) {
      local_38 = q;
      fVar10 = sqrtf(fVar10);
      q = local_38;
    }
    else {
      auVar12 = vsqrtss_avx(ZEXT416((uint)fVar10),ZEXT416((uint)fVar10));
      fVar10 = auVar12._0_4_;
    }
    fVar11 = 0.5 / fVar10;
    local_48[uVar7] = fVar10 * 0.5;
    fStack_3c = fVar11 * (*(float *)((long)this->m_el[0].m_floats + lVar6 * 4 + (ulong)uVar8) -
                         this->m_el[lVar6].m_floats[uVar2]);
    local_48[lVar6] =
         fVar11 * (this->m_el[lVar6].m_floats[uVar7] + this->m_el[uVar7].m_floats[lVar6]);
    local_48[uVar2] =
         fVar11 * (*(float *)((long)this->m_el[0].m_floats + uVar7 * 4 + (ulong)uVar8) +
                  this->m_el[uVar7].m_floats[uVar2]);
  }
  else {
    fVar3 = fVar3 + 1.0;
    if (fVar3 < 0.0) {
      auVar13._0_4_ = sqrtf(fVar3);
      auVar13._4_60_ = extraout_var;
      auVar12 = auVar13._0_16_;
    }
    else {
      auVar12 = vsqrtss_avx(ZEXT416((uint)fVar3),ZEXT416((uint)fVar3));
    }
    auVar4 = vinsertps_avx(ZEXT416((uint)(this->m_el[2].m_floats[1] - this->m_el[1].m_floats[2])),
                           ZEXT416((uint)(this->m_el[0].m_floats[2] - this->m_el[2].m_floats[0])),
                           0x10);
    auVar9 = vpermi2ps_avx512vl(_DAT_00f47d70,ZEXT416((uint)(0.5 / auVar12._0_4_)),auVar12);
    auVar12 = vinsertps_avx(auVar4,ZEXT416((uint)(this->m_el[1].m_floats[0] -
                                                 this->m_el[0].m_floats[1])),0x20);
    auVar12 = vinsertps_avx(auVar12,SUB6416(ZEXT464(0x3f000000),0),0x30);
    local_48[0] = auVar9._0_4_ * auVar12._0_4_;
    local_48[1] = auVar9._4_4_ * auVar12._4_4_;
    local_48[2] = auVar9._8_4_ * auVar12._8_4_;
    fStack_3c = auVar9._12_4_ * auVar12._12_4_;
  }
  (q->super_cbtQuadWord).m_floats[0] = local_48[0];
  (q->super_cbtQuadWord).m_floats[1] = local_48[1];
  (q->super_cbtQuadWord).m_floats[2] = local_48[2];
  (q->super_cbtQuadWord).m_floats[3] = fStack_3c;
  return;
}

Assistant:

void getRotation(cbtQuaternion & q) const
	{
#if (defined(BT_USE_SSE_IN_API) && defined(BT_USE_SSE)) || defined(BT_USE_NEON)
		cbtScalar trace = m_el[0].x() + m_el[1].y() + m_el[2].z();
		cbtScalar s, x;

		union {
			cbtSimdFloat4 vec;
			cbtScalar f[4];
		} temp;

		if (trace > cbtScalar(0.0))
		{
			x = trace + cbtScalar(1.0);

			temp.f[0] = m_el[2].y() - m_el[1].z();
			temp.f[1] = m_el[0].z() - m_el[2].x();
			temp.f[2] = m_el[1].x() - m_el[0].y();
			temp.f[3] = x;
			//temp.f[3]= s * cbtScalar(0.5);
		}
		else
		{
			int i, j, k;
			if (m_el[0].x() < m_el[1].y())
			{
				if (m_el[1].y() < m_el[2].z())
				{
					i = 2;
					j = 0;
					k = 1;
				}
				else
				{
					i = 1;
					j = 2;
					k = 0;
				}
			}
			else
			{
				if (m_el[0].x() < m_el[2].z())
				{
					i = 2;
					j = 0;
					k = 1;
				}
				else
				{
					i = 0;
					j = 1;
					k = 2;
				}
			}

			x = m_el[i][i] - m_el[j][j] - m_el[k][k] + cbtScalar(1.0);

			temp.f[3] = (m_el[k][j] - m_el[j][k]);
			temp.f[j] = (m_el[j][i] + m_el[i][j]);
			temp.f[k] = (m_el[k][i] + m_el[i][k]);
			temp.f[i] = x;
			//temp.f[i] = s * cbtScalar(0.5);
		}

		s = cbtSqrt(x);
		q.set128(temp.vec);
		s = cbtScalar(0.5) / s;

		q *= s;
#else
		cbtScalar trace = m_el[0].x() + m_el[1].y() + m_el[2].z();

		cbtScalar temp[4];

		if (trace > cbtScalar(0.0))
		{
			cbtScalar s = cbtSqrt(trace + cbtScalar(1.0));
			temp[3] = (s * cbtScalar(0.5));
			s = cbtScalar(0.5) / s;

			temp[0] = ((m_el[2].y() - m_el[1].z()) * s);
			temp[1] = ((m_el[0].z() - m_el[2].x()) * s);
			temp[2] = ((m_el[1].x() - m_el[0].y()) * s);
		}
		else
		{
			int i = m_el[0].x() < m_el[1].y() ? (m_el[1].y() < m_el[2].z() ? 2 : 1) : (m_el[0].x() < m_el[2].z() ? 2 : 0);
			int j = (i + 1) % 3;
			int k = (i + 2) % 3;

			cbtScalar s = cbtSqrt(m_el[i][i] - m_el[j][j] - m_el[k][k] + cbtScalar(1.0));
			temp[i] = s * cbtScalar(0.5);
			s = cbtScalar(0.5) / s;

			temp[3] = (m_el[k][j] - m_el[j][k]) * s;
			temp[j] = (m_el[j][i] + m_el[i][j]) * s;
			temp[k] = (m_el[k][i] + m_el[i][k]) * s;
		}
		q.setValue(temp[0], temp[1], temp[2], temp[3]);
#endif
	}